

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_e668::AudioState::decodeFrame(AudioState *this)

{
  AVRational AVar1;
  int iVar2;
  ostream *poVar3;
  AVFrame *pAVar4;
  
  while( true ) {
    if (((this->mMovie->mQuit)._M_base._M_i & 1U) != 0) {
      return 0;
    }
    while (iVar2 = avcodec_receive_frame
                             ((this->mCodecCtx)._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,
                              (this->mDecodedFrame)._M_t.
                              super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>.
                              _M_t.
                              super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                              .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl), iVar2 == -0xb)
    {
      PacketQueue<2097152UL>::sendTo
                (&this->mPackets,
                 (this->mCodecCtx)._M_t.
                 super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
    }
    if (iVar2 == -0x20464f45) break;
    if (iVar2 == 0) {
      pAVar4 = (this->mDecodedFrame)._M_t.
               super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
               super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
               super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl;
      iVar2 = pAVar4->nb_samples;
      if (0 < iVar2) {
        AVar1 = this->mStream->time_base;
        (this->mCurrentPts).__r =
             (long)((double)pAVar4->best_effort_timestamp * ((double)AVar1.num / (double)AVar1.den)
                   * 1000000000.0);
        if (this->mSamplesMax < iVar2) {
          av_freep(&this->mSamples,(ulong)AVar1 >> 0x20);
          av_samples_alloc(&this->mSamples,0,
                           ((this->mCodecCtx)._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->channels,
                           ((this->mDecodedFrame)._M_t.
                            super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                            .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl)->nb_samples,
                           this->mDstSampleFmt,0);
          pAVar4 = (this->mDecodedFrame)._M_t.
                   super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                   super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                   super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl;
          iVar2 = pAVar4->nb_samples;
          this->mSamplesMax = iVar2;
        }
        iVar2 = swr_convert((this->mSwresCtx)._M_t.
                            super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>
                            .super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl,&this->mSamples
                            ,iVar2,pAVar4,iVar2);
        av_frame_unref((this->mDecodedFrame)._M_t.
                       super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
                       super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                       super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl);
        return iVar2;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to receive frame: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return 0;
}

Assistant:

int AudioState::decodeFrame()
{
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), mDecodedFrame.get())) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        if(mDecodedFrame->nb_samples <= 0)
            continue;

        /* If provided, update w/ pts */
        if(mDecodedFrame->best_effort_timestamp != AVNoPtsValue)
            mCurrentPts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(mDecodedFrame->best_effort_timestamp)});

        if(mDecodedFrame->nb_samples > mSamplesMax)
        {
            av_freep(&mSamples);
            av_samples_alloc(&mSamples, nullptr, mCodecCtx->channels, mDecodedFrame->nb_samples,
                mDstSampleFmt, 0);
            mSamplesMax = mDecodedFrame->nb_samples;
        }
        /* Return the amount of sample frames converted */
        int data_size{swr_convert(mSwresCtx.get(), &mSamples, mDecodedFrame->nb_samples,
            const_cast<const uint8_t**>(mDecodedFrame->data), mDecodedFrame->nb_samples)};

        av_frame_unref(mDecodedFrame.get());
        return data_size;
    }

    return 0;
}